

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureLevelStateQueryTests.cpp
# Opt level: O0

bool deqp::gles31::Functional::anon_unknown_1::
     verifyTextureLevelParameterEqualWithPrinter<deqp::gles31::Functional::(anonymous_namespace)::IntegerPrinter>
               (CallLogWrapper *gl,GLenum target,int level,GLenum pname,int refValue,QueryType type)

{
  bool bVar1;
  qpTestResult qVar2;
  TestLog *pTVar3;
  MessageBuilder *pMVar4;
  int v;
  Enum<int,_2UL> EVar5;
  string local_2a0;
  GetNameFunc local_280;
  int local_278;
  Enum<int,_2UL> local_270;
  MessageBuilder local_260;
  allocator<char> local_c9;
  string local_c8;
  undefined1 local_a8 [8];
  ResultCollector result;
  QueriedState state;
  QueryType type_local;
  int refValue_local;
  GLenum pname_local;
  int level_local;
  GLenum target_local;
  CallLogWrapper *gl_local;
  
  deqp::gls::StateQueryUtil::QueriedState::QueriedState
            ((QueriedState *)((long)&result.m_message.field_2 + 8));
  pTVar3 = glu::CallLogWrapper::getLog(gl);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8," // ERROR: ",&local_c9);
  tcu::ResultCollector::ResultCollector((ResultCollector *)local_a8,pTVar3,&local_c8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::allocator<char>::~allocator(&local_c9);
  pTVar3 = glu::CallLogWrapper::getLog(gl);
  tcu::TestLog::operator<<(&local_260,pTVar3,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar4 = tcu::MessageBuilder::operator<<(&local_260,(char (*) [11])"Verifying ");
  EVar5 = glu::getTextureLevelParameterStr(pname);
  local_280 = EVar5.m_getName;
  local_278 = EVar5.m_value;
  local_270.m_getName = local_280;
  local_270.m_value = local_278;
  pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_270);
  pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [13])0x2c1ed09);
  Functional::(anonymous_namespace)::IntegerPrinter::getIntegerName_abi_cxx11_
            (&local_2a0,(IntegerPrinter *)(ulong)(uint)refValue,v);
  pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_2a0);
  tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::string::~string((string *)&local_2a0);
  tcu::MessageBuilder::~MessageBuilder(&local_260);
  deqp::gls::StateQueryUtil::queryTextureLevelState
            ((ResultCollector *)local_a8,gl,type,target,level,pname,
             (QueriedState *)((long)&result.m_message.field_2 + 8));
  bVar1 = deqp::gls::StateQueryUtil::QueriedState::isUndefined
                    ((QueriedState *)((long)&result.m_message.field_2 + 8));
  if (bVar1) {
    gl_local._7_1_ = false;
  }
  else {
    deqp::gls::StateQueryUtil::verifyInteger
              ((ResultCollector *)local_a8,(QueriedState *)((long)&result.m_message.field_2 + 8),
               refValue);
    qVar2 = tcu::ResultCollector::getResult((ResultCollector *)local_a8);
    gl_local._7_1_ = qVar2 == QP_TEST_RESULT_PASS;
  }
  tcu::ResultCollector::~ResultCollector((ResultCollector *)local_a8);
  return gl_local._7_1_;
}

Assistant:

static bool verifyTextureLevelParameterEqualWithPrinter (glu::CallLogWrapper& gl, glw::GLenum target, int level, glw::GLenum pname, int refValue, QueryType type)
{
	QueriedState			state;
	tcu::ResultCollector	result	(gl.getLog(), " // ERROR: ");

	gl.getLog() << tcu::TestLog::Message << "Verifying " << glu::getTextureLevelParameterStr(pname) << ", expecting " << Printer::getIntegerName(refValue) << tcu::TestLog::EndMessage;
	queryTextureLevelState(result, gl, type, target, level, pname, state);

	if (state.isUndefined())
		return false;

	verifyInteger(result, state, refValue);

	return result.getResult() == QP_TEST_RESULT_PASS;
}